

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfHeader.c
# Opt level: O3

_Bool queueHeader(arguments *args,queue *out)

{
  byte bVar1;
  SkeinSize_t SVar2;
  SkeinSize_t SVar3;
  uint64_t *__src;
  ulong uVar4;
  _Bool _Var5;
  uint uVar6;
  chunk *chunk;
  uint64_t *__dest;
  uint64_t uVar7;
  
  if (args->iv == (uint64_t *)0x0) {
    return false;
  }
  bVar1 = args->field_0x3c;
  SVar2 = args->state_size;
  chunk = createChunk();
  chunk->action = '\x01';
  __src = args->iv;
  if (__src != (uint64_t *)0x0) {
    uVar4 = args->file_size;
    SVar3 = args->state_size;
    _Var5 = validSize((ulong)SVar3);
    if (1 < uVar4 && _Var5) {
      uVar6 = SVar3 >> 6;
      __dest = (uint64_t *)calloc((ulong)(uVar6 * 2),8);
      memcpy(__dest,__src,(ulong)(SVar3 >> 3));
      __dest[uVar6] = 0x909202009092009;
      __dest[(ulong)uVar6 + 1] = uVar4;
      __dest[(ulong)uVar6 + 2] = (ulong)SVar3;
      uVar7 = 0x7256736572766564;
      if ((bVar1 & 0x10) == 0) {
        uVar7 = 0x5077073467643229;
      }
      __dest[(ulong)uVar6 + 3] = uVar7;
      chunk->data = __dest;
      chunk->data_size = (ulong)(SVar2 >> 2 & 0xfffffffe);
      do {
        _Var5 = enque(chunk,out);
      } while (!_Var5);
      _Var5 = true;
      goto LAB_00106624;
    }
  }
  chunk->data = (uint64_t *)0x0;
  chunk->data_size = (ulong)(SVar2 >> 2 & 0xfffffffe);
  _Var5 = false;
LAB_00106624:
  if (args->iv != (uint64_t *)0x0) {
    free(args->iv);
    args->iv = (uint64_t *)0x0;
  }
  return _Var5;
}

Assistant:

bool queueHeader(arguments* args, queue* out)
{
    pdebug("queueHeader()\n");
    
    if(args->iv == NULL) { return false; } //iv doesn't exist we can't continue

    bool success = false;
    uint16_t header_ver = (args->legacy_hash==true) ? 1 : 2; 
    const uint64_t block_byte_size = ((uint64_t)args->state_size/8);

    chunk* header = createChunk();
    header->action = ENCRYPT;
    header->data = genHeader(args->iv, args->file_size, args->state_size, header_ver);
    header->data_size = 2*block_byte_size;

    if(header->data != NULL) //check that allocate succeeded
    {
        while(enque(header, out) != true); //spin until the header has been queued
        success = true;
    }

    if(args->iv != NULL) //free the iv
    { 
        free(args->iv);
        args->iv = NULL;
    } 

    return success;
}